

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainerSMC.cpp
# Opt level: O1

void __thiscall chrono::ChContactContainerSMC::EndAddContact(ChContactContainerSMC *this)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  
  p_Var3 = (this->lastcontact_3_3)._M_node;
  while (p_Var3 != (_List_node_base *)&this->contactlist_3_3) {
    if (p_Var3[1]._M_next != (_List_node_base *)0x0) {
      (*(code *)(p_Var3[1]._M_next)->_M_next->_M_prev)();
    }
    p_Var2 = (this->lastcontact_3_3)._M_node;
    p_Var3 = p_Var2->_M_next;
    psVar1 = &(this->contactlist_3_3).
              super__List_base<chrono::ChContactSMC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var2,0x18);
    (this->lastcontact_3_3)._M_node = p_Var3;
  }
  p_Var3 = (this->lastcontact_6_3)._M_node;
  while (p_Var3 != (_List_node_base *)&this->contactlist_6_3) {
    if (p_Var3[1]._M_next != (_List_node_base *)0x0) {
      (*(code *)(p_Var3[1]._M_next)->_M_next->_M_prev)();
    }
    p_Var2 = (this->lastcontact_6_3)._M_node;
    p_Var3 = p_Var2->_M_next;
    psVar1 = &(this->contactlist_6_3).
              super__List_base<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var2,0x18);
    (this->lastcontact_6_3)._M_node = p_Var3;
  }
  p_Var3 = (this->lastcontact_6_6)._M_node;
  while (p_Var3 != (_List_node_base *)&this->contactlist_6_6) {
    if (p_Var3[1]._M_next != (_List_node_base *)0x0) {
      (*(code *)(p_Var3[1]._M_next)->_M_next->_M_prev)();
    }
    p_Var2 = (this->lastcontact_6_6)._M_node;
    p_Var3 = p_Var2->_M_next;
    psVar1 = &(this->contactlist_6_6).
              super__List_base<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var2,0x18);
    (this->lastcontact_6_6)._M_node = p_Var3;
  }
  p_Var3 = (this->lastcontact_333_3)._M_node;
  while (p_Var3 != (_List_node_base *)&this->contactlist_333_3) {
    if (p_Var3[1]._M_next != (_List_node_base *)0x0) {
      (*(code *)(p_Var3[1]._M_next)->_M_next->_M_prev)();
    }
    p_Var2 = (this->lastcontact_333_3)._M_node;
    p_Var3 = p_Var2->_M_next;
    psVar1 = &(this->contactlist_333_3).
              super__List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<3>_>_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var2,0x18);
    (this->lastcontact_333_3)._M_node = p_Var3;
  }
  p_Var3 = (this->lastcontact_333_6)._M_node;
  while (p_Var3 != (_List_node_base *)&this->contactlist_333_6) {
    if (p_Var3[1]._M_next != (_List_node_base *)0x0) {
      (*(code *)(p_Var3[1]._M_next)->_M_next->_M_prev)();
    }
    p_Var2 = (this->lastcontact_333_6)._M_node;
    p_Var3 = p_Var2->_M_next;
    psVar1 = &(this->contactlist_333_6).
              super__List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_1vars<6>_>_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var2,0x18);
    (this->lastcontact_333_6)._M_node = p_Var3;
  }
  p_Var3 = (this->lastcontact_333_333)._M_node;
  while (p_Var3 != (_List_node_base *)&this->contactlist_333_333) {
    if (p_Var3[1]._M_next != (_List_node_base *)0x0) {
      (*(code *)(p_Var3[1]._M_next)->_M_next->_M_prev)();
    }
    p_Var2 = (this->lastcontact_333_333)._M_node;
    p_Var3 = p_Var2->_M_next;
    psVar1 = &(this->contactlist_333_333).
              super__List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var2,0x18);
    (this->lastcontact_333_333)._M_node = p_Var3;
  }
  p_Var3 = (this->lastcontact_666_3)._M_node;
  while (p_Var3 != (_List_node_base *)&this->contactlist_666_3) {
    if (p_Var3[1]._M_next != (_List_node_base *)0x0) {
      (*(code *)(p_Var3[1]._M_next)->_M_next->_M_prev)();
    }
    p_Var2 = (this->lastcontact_666_3)._M_node;
    p_Var3 = p_Var2->_M_next;
    psVar1 = &(this->contactlist_666_3).
              super__List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var2,0x18);
    (this->lastcontact_666_3)._M_node = p_Var3;
  }
  p_Var3 = (this->lastcontact_666_6)._M_node;
  while (p_Var3 != (_List_node_base *)&this->contactlist_666_6) {
    if (p_Var3[1]._M_next != (_List_node_base *)0x0) {
      (*(code *)(p_Var3[1]._M_next)->_M_next->_M_prev)();
    }
    p_Var2 = (this->lastcontact_666_6)._M_node;
    p_Var3 = p_Var2->_M_next;
    psVar1 = &(this->contactlist_666_6).
              super__List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var2,0x18);
    (this->lastcontact_666_6)._M_node = p_Var3;
  }
  p_Var3 = (this->lastcontact_666_333)._M_node;
  while (p_Var3 != (_List_node_base *)&this->contactlist_666_333) {
    if (p_Var3[1]._M_next != (_List_node_base *)0x0) {
      (*(code *)(p_Var3[1]._M_next)->_M_next->_M_prev)();
    }
    p_Var2 = (this->lastcontact_666_333)._M_node;
    p_Var3 = p_Var2->_M_next;
    psVar1 = &(this->contactlist_666_333).
              super__List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<3,_3,_3>_>_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var2,0x18);
    (this->lastcontact_666_333)._M_node = p_Var3;
  }
  p_Var3 = (this->lastcontact_666_666)._M_node;
  while (p_Var3 != (_List_node_base *)&this->contactlist_666_666) {
    if (p_Var3[1]._M_next != (_List_node_base *)0x0) {
      (*(code *)(p_Var3[1]._M_next)->_M_next->_M_prev)();
    }
    p_Var2 = (this->lastcontact_666_666)._M_node;
    p_Var3 = p_Var2->_M_next;
    psVar1 = &(this->contactlist_666_666).
              super__List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var2,0x18);
    (this->lastcontact_666_666)._M_node = p_Var3;
  }
  return;
}

Assistant:

void ChContactContainerSMC::EndAddContact() {
    // remove contacts that are beyond last contact
    while (lastcontact_3_3 != contactlist_3_3.end()) {
        delete (*lastcontact_3_3);
        lastcontact_3_3 = contactlist_3_3.erase(lastcontact_3_3);
    }
    while (lastcontact_6_3 != contactlist_6_3.end()) {
        delete (*lastcontact_6_3);
        lastcontact_6_3 = contactlist_6_3.erase(lastcontact_6_3);
    }
    while (lastcontact_6_6 != contactlist_6_6.end()) {
        delete (*lastcontact_6_6);
        lastcontact_6_6 = contactlist_6_6.erase(lastcontact_6_6);
    }
    while (lastcontact_333_3 != contactlist_333_3.end()) {
        delete (*lastcontact_333_3);
        lastcontact_333_3 = contactlist_333_3.erase(lastcontact_333_3);
    }
    while (lastcontact_333_6 != contactlist_333_6.end()) {
        delete (*lastcontact_333_6);
        lastcontact_333_6 = contactlist_333_6.erase(lastcontact_333_6);
    }
    while (lastcontact_333_333 != contactlist_333_333.end()) {
        delete (*lastcontact_333_333);
        lastcontact_333_333 = contactlist_333_333.erase(lastcontact_333_333);
    }
    while (lastcontact_666_3 != contactlist_666_3.end()) {
        delete (*lastcontact_666_3);
        lastcontact_666_3 = contactlist_666_3.erase(lastcontact_666_3);
    }
    while (lastcontact_666_6 != contactlist_666_6.end()) {
        delete (*lastcontact_666_6);
        lastcontact_666_6 = contactlist_666_6.erase(lastcontact_666_6);
    }
    while (lastcontact_666_333 != contactlist_666_333.end()) {
        delete (*lastcontact_666_333);
        lastcontact_666_333 = contactlist_666_333.erase(lastcontact_666_333);
    }
    while (lastcontact_666_666 != contactlist_666_666.end()) {
        delete (*lastcontact_666_666);
        lastcontact_666_666 = contactlist_666_666.erase(lastcontact_666_666);
    }

    // while (lastcontact_roll != contactlist_roll.end()) {
    //    delete (*lastcontact_roll);
    //    lastcontact_roll = contactlist_roll.erase(lastcontact_roll);
    //}
}